

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

uint FindGivenVersion(TidyDocImpl *doc,Node *doctype)

{
  TidyAllocator *allocator;
  int iVar1;
  AttVal *pAVar2;
  ctmbstr str;
  tmbstr ptVar3;
  uint vers;
  AttVal *fpi;
  Node *doctype_local;
  TidyDocImpl *doc_local;
  
  pAVar2 = prvTidyGetAttrByName(doctype,"PUBLIC");
  if ((pAVar2 == (AttVal *)0x0) || (pAVar2->value == (tmbstr)0x0)) {
    if ((doctype->element != (tmbstr)0x0) &&
       (iVar1 = prvTidytmbstrcasecmp(doctype->element,"html"), iVar1 == 0)) {
      return 0x60000;
    }
    doc_local._4_4_ = 0;
  }
  else {
    doc_local._4_4_ = GetVersFromFPI(pAVar2->value);
    if ((doc_local._4_4_ & 0x41f00) != 0) {
      prvTidySetOptionBool(doc,TidyXmlOut,yes);
      prvTidySetOptionBool(doc,TidyXhtmlOut,yes);
      doc->lexer->isvoyager = yes;
    }
    (*doc->allocator->vtbl->free)(doc->allocator,pAVar2->value);
    allocator = doc->allocator;
    str = GetFPIFromVers(doc_local._4_4_);
    ptVar3 = prvTidytmbstrdup(allocator,str);
    pAVar2->value = ptVar3;
  }
  return doc_local._4_4_;
}

Assistant:

static uint FindGivenVersion( TidyDocImpl* doc, Node* doctype )
{
    AttVal * fpi = TY_(GetAttrByName)(doctype, "PUBLIC");
    uint vers;

    if (!fpi || !fpi->value) 
    {
        /*\
         * Is. #815 - change to case-insensitive test
         * See REC: https://www.w3.org/TR/html5/syntax.html#the-doctype
        \*/
        if (doctype->element && (TY_(tmbstrcasecmp)(doctype->element,"html") == 0))
        {
            return VERS_HTML5;  /* TODO: do we need to check MORE? */
        }
        /* TODO: Consider warning, error message */
        return VERS_UNKNOWN;
    }
    vers = GetVersFromFPI(fpi->value);

    if (VERS_XHTML & vers)
    {
        TY_(SetOptionBool)(doc, TidyXmlOut, yes);
        TY_(SetOptionBool)(doc, TidyXhtmlOut, yes);
        doc->lexer->isvoyager = yes;
    }

    /* todo: add a warning if case does not match? */
    TidyDocFree(doc, fpi->value);
    fpi->value = TY_(tmbstrdup)(doc->allocator, GetFPIFromVers(vers));

    return vers;
}